

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nam.cpp
# Opt level: O3

bool mg::data::nam_write(Nam *in,string *out)

{
  pointer pcVar1;
  pointer pbVar2;
  ulong uVar3;
  long lVar4;
  
  std::__cxx11::string::resize
            ((ulong)out,
             ((char)(in->names).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (char)(in->names).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) + ' ');
  pbVar2 = (in->names).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((in->names).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar2) {
    lVar4 = 0;
    uVar3 = 0;
    do {
      pcVar1 = (out->_M_dataplus)._M_p;
      strncpy(pcVar1 + lVar4,*(char **)((long)&(pbVar2->_M_dataplus)._M_p + lVar4),0x20);
      pcVar1 = pcVar1 + lVar4 + 0x1e;
      pcVar1[0] = '\r';
      pcVar1[1] = '\n';
      uVar3 = uVar3 + 1;
      pbVar2 = (in->names).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x20;
    } while (uVar3 < (ulong)((long)(in->names).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5));
  }
  return true;
}

Assistant:

bool nam_write(const Nam &in, std::string &out) {
  // Resize output buffer to fit string table + EOF marker
  out.resize((in.names.size() + 1) * Nam::MAX_STRLEN, '\0');

  // Insert each name, truncating if too long
  for (std ::vector<std::string>::size_type i = 0; i < in.names.size(); i++) {
    char *out_ptr = &out[i * Nam::MAX_STRLEN];
    strncpy(out_ptr, in.names[i].c_str(), Nam::MAX_STRLEN);

    // Final 2 bytes must be \r\n
    out_ptr[30] = '\r';
    out_ptr[31] = '\n';
  }

  return true;
}